

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.h
# Opt level: O3

BlendShapeChannel *
Assimp::FBX::Util::ProcessSimpleConnection<Assimp::FBX::BlendShapeChannel>
          (Connection *con,bool is_object_property_conn,char *name,Element *element,
          char **propNameOut)

{
  size_type sVar1;
  long *plVar2;
  Object *pOVar3;
  BlendShapeChannel *pBVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  undefined7 in_register_00000031;
  allocator local_79;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  sVar1 = (con->prop)._M_string_length;
  if ((int)CONCAT71(in_register_00000031,is_object_property_conn) == 0) {
    if (sVar1 != 0) {
      std::__cxx11::string::string((string *)local_38,name,&local_79);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x78b2bb);
      local_78 = &local_68;
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar2[3];
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar2;
      }
      local_70 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      psVar7 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58.field_2._8_8_ = plVar2[3];
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_58._M_string_length = plVar2[1];
      *plVar2 = (long)psVar7;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      DOMWarning(&local_58,element);
      goto LAB_005e6b4c;
    }
  }
  else {
    if (sVar1 == 0) {
      std::__cxx11::string::string((string *)local_38,name,&local_79);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x78b2bb);
      local_78 = &local_68;
      plVar2 = puVar5 + 2;
      if ((long *)*puVar5 == plVar2) {
        local_68 = *plVar2;
        lStack_60 = puVar5[3];
      }
      else {
        local_68 = *plVar2;
        local_78 = (long *)*puVar5;
      }
      local_70 = puVar5[1];
      *puVar5 = plVar2;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      psVar7 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58.field_2._8_8_ = puVar5[3];
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_58._M_string_length = puVar5[1];
      *puVar5 = psVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      DOMWarning(&local_58,element);
      goto LAB_005e6b4c;
    }
    if (propNameOut != (char **)0x0) {
      *propNameOut = (con->prop)._M_dataplus._M_p;
    }
  }
  pOVar3 = Connection::SourceObject(con);
  if (pOVar3 != (Object *)0x0) {
    pBVar4 = (BlendShapeChannel *)
             __dynamic_cast(pOVar3,&Object::typeinfo,&BlendShapeChannel::typeinfo,0);
    return pBVar4;
  }
  std::__cxx11::string::string((string *)local_38,name,&local_79);
  puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x78b334);
  local_78 = &local_68;
  plVar2 = puVar5 + 2;
  if ((long *)*puVar5 == plVar2) {
    local_68 = *plVar2;
    lStack_60 = puVar5[3];
  }
  else {
    local_68 = *plVar2;
    local_78 = (long *)*puVar5;
  }
  local_70 = puVar5[1];
  *puVar5 = plVar2;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  psVar7 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_58.field_2._M_allocated_capacity = *psVar7;
    local_58.field_2._8_8_ = puVar5[3];
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar7;
    local_58._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_58._M_string_length = puVar5[1];
  *puVar5 = psVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DOMWarning(&local_58,element);
LAB_005e6b4c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return (BlendShapeChannel *)0x0;
}

Assistant:

inline
const T* ProcessSimpleConnection(const Connection& con,
    bool is_object_property_conn,
    const char* name,
    const Element& element,
    const char** propNameOut = nullptr)
{
    if (is_object_property_conn && !con.PropertyName().length()) {
        DOMWarning("expected incoming " + std::string(name) +
            " link to be an object-object connection, ignoring",
            &element
            );
        return nullptr;
    }
    else if (!is_object_property_conn && con.PropertyName().length()) {
        DOMWarning("expected incoming " + std::string(name) +
            " link to be an object-property connection, ignoring",
            &element
            );
        return nullptr;
    }

    if(is_object_property_conn && propNameOut) {
        // note: this is ok, the return value of PropertyValue() is guaranteed to
        // remain valid and unchanged as long as the document exists.
        *propNameOut = con.PropertyName().c_str();
    }

    const Object* const ob = con.SourceObject();
    if(!ob) {
        DOMWarning("failed to read source object for incoming " + std::string(name) +
            " link, ignoring",
            &element);
        return nullptr;
    }

    return dynamic_cast<const T*>(ob);
}